

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotation.cpp
# Opt level: O1

void test_qclab_QRotation<double>(void)

{
  double unaff_RBX;
  pointer *__ptr;
  char *pcVar1;
  double unaff_retaddr;
  char *in_stack_00000008;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  AssertHelper local_20;
  internal local_18 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  _Var2._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ff0000000000000
  ;
  local_20.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            (local_18,"R.cos()","1.0",(double *)&stack0xffffffffffffffd8,(double *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xd,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  _Var2._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<double,double>
            (local_18,"R.sin()","0.0",(double *)&stack0xffffffffffffffd8,(double *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xe,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  _Var2._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<double,double>
            (local_18,"R.theta()","0.0",(double *)&stack0xffffffffffffffd8,(double *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x132ee3,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x14,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x132f90,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x15,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x13303d,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x16,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )_Var2._M_head_impl !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x1330ea,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x1a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x133197,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x1b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x133244,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x1c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x1332f1,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x20,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x13339e,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x21,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x13344b,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x22,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x1334f8,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x31,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x1335a5,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x32,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x133652,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x33,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x1336ff,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x3a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x1337ac,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x3b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x133859,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x3c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x133906,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x42,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x1339b3,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x43,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x133a60,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x44,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x133b0d,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x4a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x133bba,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x4b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x133c67,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x4c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x133d14,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x54,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x133dc1,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x55,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x133e6e,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x56,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x133f1b,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x5e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x133fc8,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x5f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134075,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x60,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134122,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x72,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x1341cf,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x73,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x13427c,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x74,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134329,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x75,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x1343d6,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x76,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134483,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x77,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134530,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x89,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x1345dd,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x8a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x13468a,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x8b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134737,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x8c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x1347e4,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x8d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134891,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0x8e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x13493e,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xa0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x1349eb,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xa1,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134a98,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xa2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134b45,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xb4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134bf2,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xb5,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134c9f,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xb6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134d4c,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xc3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134df9,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xc4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134ea6,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xc5,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x134f53,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,0xc6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x135000,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,199,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)0x1350ad,in_stack_00000008,unaff_retaddr,unaff_RBX,
             (double)in_stack_fffffffffffffff0);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (in_stack_fffffffffffffff0 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_fffffffffffffff0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/test/QRotation.cpp"
               ,200,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (in_stack_fffffffffffffff0 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffff0,in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

void test_qclab_QRotation() {

  const T pi = 4 * std::atan(1) ;
  const T tol = 10 * std::numeric_limits< T >::epsilon() ;

  {
    qclab::QRotation< T >  R ;

    EXPECT_EQ( R.cos() , 1.0 ) ;    // cos
    EXPECT_EQ( R.sin() , 0.0 ) ;    // sin
    EXPECT_EQ( R.theta() , 0.0 ) ;  // theta

    // update(angle)
    qclab::QAngle< T >  new_angle( 0.5 ) ;
    R.update( new_angle ) ;
    EXPECT_NEAR( R.theta() , 1 , tol ) ;
    EXPECT_NEAR( R.cos() , std::cos( 0.5 ) , tol ) ;
    EXPECT_NEAR( R.sin() , std::sin( 0.5 ) , tol ) ;

    // update(theta)
    R.update( pi/2 ) ;
    EXPECT_NEAR( R.theta() , pi/2 , tol ) ;
    EXPECT_NEAR( R.cos() , std::cos( pi/4 ) , tol ) ;
    EXPECT_NEAR( R.sin() , std::sin( pi/4 ) , tol ) ;

    // update(cos,sin)
    R.update( std::cos( pi/3 ) , std::sin( pi/3 ) ) ;
    EXPECT_NEAR( R.cos() , std::cos( pi/3 ) , tol ) ;
    EXPECT_NEAR( R.sin() , std::sin( pi/3 ) , tol ) ;
    EXPECT_NEAR( R.theta() , 2*(pi/3) , tol ) ;

    // operators == and !=
    qclab::QRotation< T >  R2( std::cos( pi/3 ) , std::sin( pi/3 ) ) ;
    EXPECT_TRUE( R == R2 ) ;
    EXPECT_FALSE( R != R2 ) ;
    R2.update( 1 ) ;
    EXPECT_TRUE( R != R2 ) ;
    EXPECT_FALSE( R == R2 ) ;
}

  {
    qclab::QAngle< T > angle( pi/2 ) ;
    qclab::QRotation< T >  R( angle ) ;

    EXPECT_NEAR( R.theta() , pi , tol ) ;              // theta
    EXPECT_NEAR( R.cos() , std::cos( pi/2 ) , tol ) ;  // cos
    EXPECT_NEAR( R.sin() , std::sin( pi/2 ) , tol ) ;  // sin
  }

  {
    qclab::QAngle< T > angle( pi/2 ) ;
    qclab::QRotation< T >  R( angle ) ;

    EXPECT_NEAR( R.theta() , pi , tol ) ;              // theta
    EXPECT_NEAR( R.cos() , std::cos( pi/2 ) , tol ) ;  // cos
    EXPECT_NEAR( R.sin() , std::sin( pi/2 ) , tol ) ;  // sin
  }

  {
    qclab::QRotation< T >  R( pi/2 ) ;

    EXPECT_NEAR( R.theta() , pi/2 , tol ) ;            // theta
    EXPECT_NEAR( R.cos() , std::cos( pi/4 ) , tol ) ;  // cos
    EXPECT_NEAR( R.sin() , std::sin( pi/4 ) , tol ) ;  // sin
  }

  {
    qclab::QRotation< T >  R( pi/2 ) ;

    EXPECT_NEAR( R.theta() , pi/2 , tol ) ;            // theta
    EXPECT_NEAR( R.cos() , std::cos( pi/4 ) , tol ) ;  // cos
    EXPECT_NEAR( R.sin() , std::sin( pi/4 ) , tol ) ;  // sin
  }

  {
    const T cos = std::cos( pi/4 ) ;
    const T sin = std::sin( pi/4 ) ;
    qclab::QRotation< T >  R( cos , sin ) ;

    EXPECT_NEAR( R.theta() , pi/2 , tol ) ;  // theta
    EXPECT_NEAR( R.cos() , cos , tol ) ;     // cos
    EXPECT_NEAR( R.sin() , sin , tol ) ;     // sin
  }

  {
    const T cos = std::cos( pi/4 ) ;
    const T sin = std::sin( pi/4 ) ;
    qclab::QRotation< T >  R( cos , sin ) ;

    EXPECT_NEAR( R.theta() , pi/2 , tol ) ;  // theta
    EXPECT_NEAR( R.cos() , cos , tol ) ;     // cos
    EXPECT_NEAR( R.sin() , sin , tol ) ;     // sin
  }

  {
    const T theta1 = pi/2 ;
    const qclab::QAngle< T >  angle1( theta1 ) ;
    qclab::QRotation< T >  R1( angle1 ) ;

    const T theta2 = pi/3 ;
    const qclab::QAngle< T >  angle2( theta2 ) ;
    qclab::QRotation< T >  R2( angle2 ) ;

    // operator *=
    R1 *= R2 ;
    qclab::QAngle< T >  angle = angle1 + angle2 ;
    T cos   = angle.cos() ;
    T sin   = angle.sin() ;
    T theta = angle.theta() ;
    EXPECT_NEAR( R1.cos() , cos , tol ) ;                 // cos
    EXPECT_NEAR( R1.sin() , sin , tol ) ;                 // sin
    EXPECT_NEAR( R1.theta() , 2*theta , tol ) ;           // theta
    EXPECT_NEAR( R2.cos() , std::cos( theta2 ) , tol ) ;  // cos
    EXPECT_NEAR( R2.sin() , std::sin( theta2 ) , tol ) ;  // sin
    EXPECT_NEAR( R2.theta() , 2*theta2 , tol ) ;          // theta
  }

  {
    const T theta1 = pi/2 ;
    const qclab::QAngle< T >  angle1( theta1 ) ;
    qclab::QRotation< T >  R1( angle1 ) ;

    const T theta2 = pi/3 ;
    const qclab::QAngle< T >  angle2( theta2 ) ;
    qclab::QRotation< T >  R2( angle2 ) ;

    // operator /=
    R1 /= R2 ;
    qclab::QAngle< T >  angle = angle1 - angle2 ;
    T cos   = angle.cos() ;
    T sin   = angle.sin() ;
    T theta = angle.theta() ;
    EXPECT_NEAR( R1.cos() , cos , tol ) ;                 // cos
    EXPECT_NEAR( R1.sin() , sin , tol ) ;                 // sin
    EXPECT_NEAR( R1.theta() , 2*theta , tol ) ;           // theta
    EXPECT_NEAR( R2.cos() , std::cos( theta2 ) , tol ) ;  // cos
    EXPECT_NEAR( R2.sin() , std::sin( theta2 ) , tol ) ;  // sin
    EXPECT_NEAR( R2.theta() , 2*theta2 , tol ) ;          // theta
  }

  {
    const T theta1 = pi/2 ;
    const qclab::QAngle< T >  angle1( theta1 ) ;
    qclab::QRotation< T >  R1( angle1 ) ;

    const T theta2 = pi/3 ;
    const qclab::QAngle< T >  angle2( theta2 ) ;
    qclab::QRotation< T >  R2( angle2 ) ;

    // operator *
    qclab::QRotation< T > R = R1 * R2 ;
    qclab::QAngle< T >  angle = angle1 + angle2 ;
    T cos   = angle.cos() ;
    T sin   = angle.sin() ;
    T theta = angle.theta() ;
    EXPECT_NEAR( R.cos() , cos , tol ) ;        // cos
    EXPECT_NEAR( R.sin() , sin , tol ) ;        // sin
    EXPECT_NEAR( R.theta() , 2*theta , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const qclab::QAngle< T >  angle1( theta1 ) ;
    qclab::QRotation< T >  R1( angle1 ) ;

    const T theta2 = pi/3 ;
    const qclab::QAngle< T >  angle2( theta2 ) ;
    qclab::QRotation< T >  R2( angle2 ) ;

    // operator /
    qclab::QRotation< T > R = R1 / R2 ;
    qclab::QAngle< T >  angle = angle1 - angle2 ;
    T cos   = angle.cos() ;
    T sin   = angle.sin() ;
    T theta = angle.theta() ;
    EXPECT_NEAR( R.cos() , cos , tol ) ;        // cos
    EXPECT_NEAR( R.sin() , sin , tol ) ;        // sin
    EXPECT_NEAR( R.theta() , 2*theta , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const qclab::QAngle< T >  angle1( theta1 ) ;
    qclab::QRotation< T >  R1( angle1 ) ;
    T cos   = R1.cos() ;
    T sin   = R1.sin() ;
    T theta = R1.theta() ;

    // inv
    qclab::QRotation< T >  R2 = R1.inv() ;
    EXPECT_NEAR( R1.cos() ,  cos , tol ) ;      // cos
    EXPECT_NEAR( R2.cos() ,  cos , tol ) ;      // cos
    EXPECT_NEAR( R1.sin() ,  sin , tol ) ;      // sin
    EXPECT_NEAR( R2.sin() , -sin , tol ) ;      // sin
    EXPECT_NEAR( R1.theta() ,  theta , tol ) ;  // theta
    EXPECT_NEAR( R2.theta() , -theta , tol ) ;  // theta
  }

}